

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2metrics.h
# Opt level: O1

int __thiscall S2::Metric<1>::GetLevelForMaxValue(Metric<1> *this,double value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  S2LogMessage local_40;
  S2LogMessage local_30;
  
  iVar4 = 0x1e;
  if (0.0 < value) {
    iVar2 = ilogb(value / this->deriv_);
    bVar1 = false;
    iVar3 = -iVar2;
    if (-1 < iVar2) {
      iVar3 = 0;
    }
    iVar4 = 0x1e;
    if (-0x1e < iVar2) {
      iVar4 = iVar3;
    }
    if (iVar4 != 0x1e) {
      dVar5 = ldexp(this->deriv_,-iVar4);
      bVar1 = value < dVar5;
    }
    if (bVar1) {
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2metrics.h"
                 ,0xae,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.stream_,
                 "Check failed: level == S2::kMaxCellLevel || GetValue(level) <= value ",0x45);
      if (bVar1) goto LAB_00196d09;
    }
    if (iVar4 == 0) {
      bVar1 = false;
    }
    else {
      dVar5 = ldexp(this->deriv_,1 - iVar4);
      bVar1 = dVar5 <= value;
    }
    if (bVar1) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2metrics.h"
                 ,0xaf,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: level == 0 || GetValue(level - 1) > value ",0x38);
      if (bVar1) {
LAB_00196d09:
        abort();
      }
    }
  }
  return iVar4;
}

Assistant:

int S2::Metric<dim>::GetLevelForMaxValue(double value) const {
  if (value <= 0) return S2::kMaxCellLevel;

  // This code is equivalent to computing a floating-point "level"
  // value and rounding up.  ilogb() returns the exponent corresponding to a
  // fraction in the range [1,2).
  int level = ilogb(value / deriv_);
  level = std::max(0, std::min(S2::kMaxCellLevel, -(level >> (dim - 1))));
  S2_DCHECK(level == S2::kMaxCellLevel || GetValue(level) <= value);
  S2_DCHECK(level == 0 || GetValue(level - 1) > value);
  return level;
}